

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

int __thiscall PP_Expression::shift_expression(PP_Expression *this)

{
  qsizetype *pqVar1;
  int iVar2;
  Token TVar3;
  int iVar4;
  
  iVar2 = additive_expression(this);
  TVar3 = Parser::next(&this->super_Parser);
  if (TVar3 == LTLT) {
    iVar4 = shift_expression(this);
    iVar2 = iVar2 << ((byte)iVar4 & 0x1f);
  }
  else if (TVar3 == GTGT) {
    iVar4 = shift_expression(this);
    iVar2 = iVar2 >> ((byte)iVar4 & 0x1f);
  }
  else {
    pqVar1 = &(this->super_Parser).index;
    *pqVar1 = *pqVar1 + -1;
  }
  return iVar2;
}

Assistant:

int PP_Expression::shift_expression()
{
    int value = additive_expression();
    switch (next()) {
    case PP_LTLT:
        return value << shift_expression();
    case PP_GTGT:
        return value >> shift_expression();
    default:
        prev();
        return value;
    }
}